

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaCuFunc.cpp
# Opt level: O3

void __thiscall NaCustomFunc::Load(NaCustomFunc *this,NaDataStream *ds)

{
  NaVector *this_00;
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  char *pcVar3;
  size_t sVar4;
  NaReal *pNVar5;
  size_t sVar6;
  char *__s;
  char *pcVar7;
  char *szPrevOpt;
  double dVar8;
  
  (*(this->super_NaUnit).super_NaLogging._vptr_NaLogging[0xe])();
  this_00 = &this->vInitial;
LAB_001536f2:
  do {
    while( true ) {
      iVar1 = (*ds->_vptr_NaDataStream[3])(ds);
      pcVar7 = (char *)CONCAT44(extraout_var,iVar1);
      pcVar3 = strtok(pcVar7," ");
      sVar4 = strlen(pcVar7);
      pcVar7 = pcVar7 + sVar4 + 1;
      iVar1 = strcmp(pcVar3,"file");
      if (iVar1 != 0) break;
      pcVar7 = strtok(pcVar7," ");
      if (this->szFile != (char *)0x0) {
        operator_delete__(this->szFile);
      }
      sVar4 = strlen(pcVar7);
      pcVar3 = (char *)operator_new__(sVar4 + 1);
      this->szFile = pcVar3;
LAB_001537f6:
      strcpy(pcVar3,pcVar7);
    }
    iVar1 = strcmp(pcVar3,"options");
    if (iVar1 != 0) {
      iVar1 = strcmp(pcVar3,"initial");
      if (iVar1 == 0) {
        pcVar3 = strtok(pcVar7," ");
        while (pcVar3 != (char *)0x0) {
          uVar2 = NaVector::dim(this_00);
          NaVector::new_dim(this_00,uVar2 + 1);
          dVar8 = atof(pcVar3);
          uVar2 = NaVector::dim(this_00);
          pNVar5 = NaVector::operator[](this_00,uVar2 - 1);
          *pNVar5 = dVar8;
          pcVar3 = strtok((char *)0x0," ");
        }
      }
      goto LAB_001536f2;
    }
    pcVar3 = this->szOptions;
    if (pcVar3 == (char *)0x0) {
      sVar4 = strlen(pcVar7);
      pcVar3 = (char *)operator_new__(sVar4 + 1);
      this->szOptions = pcVar3;
      goto LAB_001537f6;
    }
    sVar4 = strlen(pcVar3);
    sVar6 = strlen(pcVar7);
    __s = (char *)operator_new__(sVar4 + sVar6 + 2);
    this->szOptions = __s;
    sprintf(__s,"%s %s",pcVar3,pcVar7);
  } while( true );
}

Assistant:

void
NaCustomFunc::Load (NaDataStream& ds)
{
  // Remove all previous functions
  Clean();

  // Read line-by-line
  while(true){
    try{
      char	*szKey, *szArg, *s = ds.GetData();

      szKey = strtok(s, " ");
      szArg = s + strlen(s) + 1;

      if(!strcmp(szKey, NaCF_file)){
	char	*filename = strtok(szArg, " ");

	// Replace file instead of old one
	if(NULL != szFile)
	  delete[] szFile;
	szFile = new char[strlen(filename) + 1];
	strcpy(szFile, filename);
      }else if(!strcmp(szKey, NaCF_options)){
	// Concatenate options
	if(NULL == szOptions){
	  szOptions = new char[strlen(szArg) + 1];
	  strcpy(szOptions, szArg);
	}else{
	  char	*szPrevOpt = szOptions;
	  szOptions = new char[strlen(szPrevOpt) + strlen(szArg) + 2];
	  sprintf(szOptions, "%s %s", szPrevOpt, szArg);
	}
      }else if(!strcmp(szKey, NaCF_initial)){
	char	*number;
	for(number = strtok(szArg, " ");
	    NULL != number;
	    number = strtok(NULL, " ")){
	  vInitial.new_dim(vInitial.dim() + 1);
	  vInitial[vInitial.dim() - 1] = atof(number);
	}
      }
    }catch(NaException exCode){
      if(na_end_of_partition == exCode ||
	 na_end_of_file == exCode)
	break;
      NaPrintLog("Exception %s while NaCustomFunc::Load(ds)\n",
		 NaExceptionMsg(exCode));
    }
  }

  if(NULL == szFile){
    NaPrintLog("Shared object file is not defined for %s (instance %s).\n",
	       GetType(),
	       (NULL==GetInstance())? "is not defined": GetInstance());
    return;
  }

  // Try to load shared object file at standard location
  if(NULL != getenv(NaEXFUNC_DIR_ENV)){
    char	*filepath = new char[strlen(getenv(NaEXFUNC_DIR_ENV))
				    + strlen(szFile)
				    + strlen(NaEXFUNC_DIR_SEP)
				    + strlen(NaEXFUNC_FILE_EXT) + 1];
    sprintf(filepath, "%s%s%s%s", getenv(NaEXFUNC_DIR_ENV),
	    NaEXFUNC_DIR_SEP, szFile, NaEXFUNC_FILE_EXT);
    NaPrintLog("Loading '%s' ...\n", filepath);
#ifdef WIN32
    so = LoadLibrary(filepath);
    if(NULL == so)
      NaPrintLog("Cannot find shared object '%s': 0x%08x\n",
		 filepath, GetLastError());
#else
    so = dlopen(filepath, RTLD_LAZY);
    if(NULL == so)
      NaPrintLog("Cannot find shared object '%s': %s\n",
		 filepath, dlerror());
#endif
    delete[] filepath;
  }

  // Try to load shared object file by default system rule
  if(NULL == so){
    char	*filepath = new char[strlen(szFile)
				    + strlen(NaEXFUNC_FILE_EXT) + 1];
    sprintf(filepath, "%s%s", szFile, NaEXFUNC_FILE_EXT);

    NaPrintLog("Loading '%s' ...\n", filepath);
#ifdef WIN32
    so = LoadLibrary(filepath);
#else
    so = dlopen(filepath, RTLD_LAZY);
#endif
    delete[] filepath;
  }
  if(NULL == so){
#ifdef WIN32
    NaPrintLog("Failed to open '%s': 0x%08x\n", szFile, GetLastError());
#else
    NaPrintLog("Failed to open '%s': %s\n", szFile, dlerror());
#endif
    return;
  }

  NaCreateExternFuncProto	create =
#ifdef WIN32
	(NaCreateExternFuncProto)GetProcAddress(so, NaCreateExternFunc);
#else
	(NaCreateExternFuncProto)dlsym(so, NaCreateExternFunc);
#endif
	if(NULL == create){
#ifdef WIN32
		NaPrintLog("Bad external function object: 0x%08x\n", GetLastError());
		FreeLibrary(so);
#else
		NaPrintLog("Bad external function object: %s\n", dlerror());
		dlclose(so);
#endif
		so = NULL;
    return;
  }

  exfunc = (*create)(szOptions, vInitial);
  Assign(exfunc->InputDim(), exfunc->OutputDim());
}